

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O0

int GetCode(gif_source_ptr sinfo)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined4 uVar4;
  int iVar5;
  long in_RDI;
  int count;
  int offs;
  int accum;
  U_CHAR *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  while( true ) {
    if (*(int *)(in_RDI + 0x14c) + *(int *)(in_RDI + 0x164) <= *(int *)(in_RDI + 0x148)) {
      iVar5 = *(int *)(in_RDI + 0x14c) >> 3;
      uVar1 = *(undefined1 *)(in_RDI + 0x40 + (long)(iVar5 + 2));
      uVar2 = *(undefined1 *)(in_RDI + 0x40 + (long)(iVar5 + 1));
      uVar3 = *(undefined1 *)(in_RDI + 0x40 + (long)iVar5);
      uVar4 = *(undefined4 *)(in_RDI + 0x14c);
      *(int *)(in_RDI + 0x14c) = *(int *)(in_RDI + 0x164) + *(int *)(in_RDI + 0x14c);
      return (int)(uint)CONCAT21(CONCAT11(uVar1,uVar2),uVar3) >> ((byte)uVar4 & 7) &
             (1 << ((byte)*(undefined4 *)(in_RDI + 0x164) & 0x1f)) - 1U;
    }
    if (*(int *)(in_RDI + 0x150) != 0) {
      *(undefined4 *)(in_RDI + 0x150) = 0;
      return *(int *)(in_RDI + 0x15c);
    }
    if (*(int *)(in_RDI + 0x154) != 0) {
      *(undefined4 *)(**(long **)(in_RDI + 0x30) + 0x28) = 0x403;
      (**(code **)(**(long **)(in_RDI + 0x30) + 8))(*(undefined8 *)(in_RDI + 0x30),0xffffffff);
      return *(int *)(in_RDI + 0x160);
    }
    *(undefined1 *)(in_RDI + 0x40) =
         *(undefined1 *)(in_RDI + 0x40 + (long)(*(int *)(in_RDI + 0x144) + -2));
    *(undefined1 *)(in_RDI + 0x41) =
         *(undefined1 *)(in_RDI + 0x40 + (long)(*(int *)(in_RDI + 0x144) + -1));
    in_stack_ffffffffffffffe4 =
         GetDataBlock((gif_source_ptr)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    if (in_stack_ffffffffffffffe4 == 0) break;
    *(int *)(in_RDI + 0x14c) = (*(int *)(in_RDI + 0x14c) - *(int *)(in_RDI + 0x148)) + 0x10;
    *(int *)(in_RDI + 0x144) = in_stack_ffffffffffffffe4 + 2;
    *(int *)(in_RDI + 0x148) = *(int *)(in_RDI + 0x144) << 3;
  }
  *(undefined4 *)(in_RDI + 0x154) = 1;
  *(undefined4 *)(**(long **)(in_RDI + 0x30) + 0x28) = 0x403;
  (**(code **)(**(long **)(in_RDI + 0x30) + 8))(*(undefined8 *)(in_RDI + 0x30),0xffffffff);
  return *(int *)(in_RDI + 0x160);
}

Assistant:

LOCAL(int)
GetCode(gif_source_ptr sinfo)
/* Fetch the next code_size bits from the GIF data */
/* We assume code_size is less than 16 */
{
  register int accum;
  int offs, count;

  while (sinfo->cur_bit + sinfo->code_size > sinfo->last_bit) {
    /* Time to reload the buffer */
    /* First time, share code with Clear case */
    if (sinfo->first_time) {
      sinfo->first_time = FALSE;
      return sinfo->clear_code;
    }
    if (sinfo->out_of_blocks) {
      WARNMS(sinfo->cinfo, JWRN_GIF_NOMOREDATA);
      return sinfo->end_code;   /* fake something useful */
    }
    /* preserve last two bytes of what we have -- assume code_size <= 16 */
    sinfo->code_buf[0] = sinfo->code_buf[sinfo->last_byte-2];
    sinfo->code_buf[1] = sinfo->code_buf[sinfo->last_byte-1];
    /* Load more bytes; set flag if we reach the terminator block */
    if ((count = GetDataBlock(sinfo, &sinfo->code_buf[2])) == 0) {
      sinfo->out_of_blocks = TRUE;
      WARNMS(sinfo->cinfo, JWRN_GIF_NOMOREDATA);
      return sinfo->end_code;   /* fake something useful */
    }
    /* Reset counters */
    sinfo->cur_bit = (sinfo->cur_bit - sinfo->last_bit) + 16;
    sinfo->last_byte = 2 + count;
    sinfo->last_bit = sinfo->last_byte * 8;
  }

  /* Form up next 24 bits in accum */
  offs = sinfo->cur_bit >> 3;   /* byte containing cur_bit */
  accum = UCH(sinfo->code_buf[offs + 2]);
  accum <<= 8;
  accum |= UCH(sinfo->code_buf[offs + 1]);
  accum <<= 8;
  accum |= UCH(sinfo->code_buf[offs]);

  /* Right-align cur_bit in accum, then mask off desired number of bits */
  accum >>= (sinfo->cur_bit & 7);
  sinfo->cur_bit += sinfo->code_size;
  return accum & ((1 << sinfo->code_size) - 1);
}